

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

bool __thiscall Wasm::PolymorphicEmitInfo::IsUnreachable(PolymorphicEmitInfo *this)

{
  uint uVar1;
  bool bVar2;
  EmitInfo *pEVar3;
  ulong uVar4;
  uint32 i;
  ulong uVar5;
  
  uVar1 = this->count;
  uVar4 = (ulong)uVar1;
  if (uVar4 == 0) {
    return false;
  }
  if (uVar1 != 1) {
    uVar5 = 0;
    do {
      bVar2 = uVar4 != uVar5;
      if (uVar4 == uVar5) {
        return bVar2;
      }
      pEVar3 = (this->field_1).infos + uVar5;
      uVar5 = uVar5 + 1;
    } while (pEVar3->type != Any);
    return bVar2;
  }
  return (this->field_1).singleInfo.type == Any;
}

Assistant:

bool PolymorphicEmitInfo::IsUnreachable() const
{
    if (count == 0)
    {
        return false;
    }
    if (count == 1)
    {
        return singleInfo.type == WasmTypes::Any;
    }
    for (uint32 i = 0; i < count; ++i)
    {
        if (infos[i].type == WasmTypes::Any)
        {
            return true;
        }
    }
    return false;
}